

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::python::Generator::FixOptionsForMessage
          (Generator *this,Descriptor *descriptor)

{
  int iVar1;
  long lVar2;
  long lVar3;
  string descriptor_name;
  string message_options;
  string local_60;
  string local_40;
  
  if (0 < *(int *)(descriptor + 0x70)) {
    lVar3 = 0;
    lVar2 = 0;
    do {
      FixOptionsForMessage(this,(Descriptor *)(*(long *)(descriptor + 0x38) + lVar3));
      lVar2 = lVar2 + 1;
      lVar3 = lVar3 + 0x88;
    } while (lVar2 < *(int *)(descriptor + 0x70));
  }
  if (0 < *(int *)(descriptor + 0x68)) {
    lVar3 = 0;
    lVar2 = 0;
    do {
      FixOptionsForOneof(this,(OneofDescriptor *)(*(long *)(descriptor + 0x30) + lVar3));
      lVar2 = lVar2 + 1;
      lVar3 = lVar3 + 0x28;
    } while (lVar2 < *(int *)(descriptor + 0x68));
  }
  if (0 < *(int *)(descriptor + 0x74)) {
    lVar3 = 0;
    lVar2 = 0;
    do {
      FixOptionsForEnum(this,(EnumDescriptor *)(*(long *)(descriptor + 0x40) + lVar3));
      lVar2 = lVar2 + 1;
      lVar3 = lVar3 + 0x48;
    } while (lVar2 < *(int *)(descriptor + 0x74));
  }
  if (0 < *(int *)(descriptor + 4)) {
    lVar3 = 0;
    lVar2 = 0;
    do {
      FixOptionsForField(this,(FieldDescriptor *)(*(long *)(descriptor + 0x28) + lVar3));
      lVar2 = lVar2 + 1;
      lVar3 = lVar3 + 0x48;
    } while (lVar2 < *(int *)(descriptor + 4));
  }
  if (0 < *(int *)(descriptor + 0x7c)) {
    lVar3 = 0;
    lVar2 = 0;
    do {
      FixOptionsForField(this,(FieldDescriptor *)(*(long *)(descriptor + 0x50) + lVar3));
      lVar2 = lVar2 + 1;
      lVar3 = lVar3 + 0x48;
    } while (lVar2 < *(int *)(descriptor + 0x7c));
  }
  MessageLite::SerializeAsString_abi_cxx11_(&local_60,*(MessageLite **)(descriptor + 0x20));
  OptionsValue(&local_40,this,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  iVar1 = std::__cxx11::string::compare((char *)&local_40);
  if (iVar1 != 0) {
    ModuleLevelDescriptorName<google::protobuf::Descriptor>(&local_60,this,descriptor);
    io::Printer::Print<char[11],std::__cxx11::string,char[17],std::__cxx11::string>
              (this->printer_,
               "$descriptor$._options = None\n$descriptor$._serialized_options = $serialized_value$\n"
               ,(char (*) [11])0x43d321,&local_60,(char (*) [17])"serialized_value",&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Generator::FixOptionsForMessage(const Descriptor& descriptor) const {
  // Nested messages.
  for (int i = 0; i < descriptor.nested_type_count(); ++i) {
    FixOptionsForMessage(*descriptor.nested_type(i));
  }
  // Oneofs.
  for (int i = 0; i < descriptor.oneof_decl_count(); ++i) {
    FixOptionsForOneof(*descriptor.oneof_decl(i));
  }
  // Enums.
  for (int i = 0; i < descriptor.enum_type_count(); ++i) {
    FixOptionsForEnum(*descriptor.enum_type(i));
  }
  // Fields.
  for (int i = 0; i < descriptor.field_count(); ++i) {
    const FieldDescriptor& field = *descriptor.field(i);
    FixOptionsForField(field);
  }
  // Extensions.
  for (int i = 0; i < descriptor.extension_count(); ++i) {
    const FieldDescriptor& field = *descriptor.extension(i);
    FixOptionsForField(field);
  }
  // Message option for this message.
  std::string message_options =
      OptionsValue(descriptor.options().SerializeAsString());
  if (message_options != "None") {
    std::string descriptor_name = ModuleLevelDescriptorName(descriptor);
    PrintDescriptorOptionsFixingCode(descriptor_name, message_options,
                                     printer_);
  }
}